

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void (anonymous_namespace)::testDiskAttrValue<Imf_2_5::TypedAttribute<int>>
               (Header *diskHeader,TypedAttribute<int> *testAttribute)

{
  Attribute *pAVar1;
  TypedAttribute<int> *this;
  int *piVar2;
  InputExc *this_00;
  TypedAttribute<int> *in_RSI;
  TypedAttribute<int> *diskAttr;
  string *attrName;
  string *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar3;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  TypedAttribute<int> *local_10;
  
  local_10 = in_RSI;
  (*(in_RSI->super_Attribute)._vptr_Attribute[2])();
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__a);
  std::allocator<char>::~allocator(&local_39);
  local_18 = local_38;
  pAVar1 = Imf_2_5::Header::operator[]
                     ((Header *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  this = (TypedAttribute<int> *)
         __dynamic_cast(pAVar1,&Imf_2_5::Attribute::typeinfo,&Imf_2_5::TypedAttribute<int>::typeinfo
                        ,0);
  if (this == (TypedAttribute<int> *)0x0) {
    __cxa_bad_cast();
  }
  piVar2 = Imf_2_5::TypedAttribute<int>::value(this);
  iVar3 = *piVar2;
  piVar2 = Imf_2_5::TypedAttribute<int>::value(local_10);
  if (iVar3 != *piVar2) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(this_00,"incorrect value from disk");
    __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testDiskAttrValue (const Header & diskHeader, const T & testAttribute)
{
    const string & attrName = testAttribute.typeName();
    const T & diskAttr = dynamic_cast <const T &> (diskHeader[attrName]);
    if (diskAttr.value() != testAttribute.value())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}